

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O0

void __thiscall utf8_valid_3_bytes_Test::TestBody(utf8_valid_3_bytes_Test *this)

{
  bool bVar1;
  undefined1 local_1e;
  undefined4 local_1c;
  int iStack_18;
  bool is_valid;
  int cu2;
  int cu1;
  int cu0;
  utf8_valid_3_bytes_Test *this_local;
  
  for (cu2 = 0xe1; cu2 < 0xf0; cu2 = cu2 + 1) {
    if (cu2 != 0xed) {
      for (iStack_18 = 0; iStack_18 < 0x100; iStack_18 = iStack_18 + 1) {
        for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
          bVar1 = anon_unknown.dwarf_87deb::is_in_range(iStack_18,0x80,0xc0);
          local_1e = false;
          if (bVar1) {
            local_1e = anon_unknown.dwarf_87deb::is_in_range(local_1c,0x80,0xc0);
          }
          anon_unknown.dwarf_87deb::assert_is_valid_utf8(local_1e,3,cu2,iStack_18,local_1c,0);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(utf8, valid_3_bytes) {
  FOR_RANGE(cu0, 0xe1, 0xf0) {
    // Handle 0xed in valid_3_bytes_ed.
    if (cu0 == 0xed) {
      continue;
    }

    FOR_EACH_BYTE(cu1) {
      FOR_EACH_BYTE(cu2) {
        bool is_valid =
            is_in_range(cu1, 0x80, 0xc0) && is_in_range(cu2, 0x80, 0xc0);
        assert_is_valid_utf8(is_valid, 3, cu0, cu1, cu2);
      }
    }
  }
}